

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

char * cashew::JSPrinter::numToString(double d,bool finalize)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined4 *puVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  char *__s;
  uint uVar13;
  long lVar14;
  undefined7 in_register_00000039;
  long lVar15;
  int iVar16;
  byte bVar17;
  char *pcVar18;
  long *in_FS_OFFSET;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar22;
  double local_80;
  double temp;
  char *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  ulong uStack_60;
  double local_58;
  double local_50;
  uint local_44;
  undefined2 local_40;
  char cStack_3e;
  char cStack_3d;
  undefined1 auStack_3c [4];
  unsigned_long_long tempULL;
  
  local_44 = (uint)CONCAT71(in_register_00000039,finalize);
  if (NAN(d)) {
    pcVar4 = "-NaN";
    pcVar18 = "-NaN";
  }
  else {
    if ((ulong)ABS(d) < 0x7ff0000000000000) {
      uStack_60 = CONCAT44(in_XMM0_Dd,in_XMM0_Dc) ^ 0x8000000000000000;
      dVar22 = -d;
      if (-d <= d) {
        dVar22 = d;
      }
      local_68 = SUB84(dVar22,0);
      uStack_64 = (undefined4)((ulong)dVar22 >> 0x20);
      tempULL._7_1_ = ::wasm::isInteger(dVar22);
      pcVar18 = (char *)(*in_FS_OFFSET + 1);
      pcVar4 = (char *)(*in_FS_OFFSET + 1);
      local_44 = local_44 ^ 1;
      uVar20 = 0;
      uVar21 = 0x7ff80000;
      local_50 = NAN;
      iVar16 = 0;
      temp = (double)pcVar18;
      local_70 = pcVar4;
      do {
        __s = pcVar18;
        if (iVar16 != 0) {
          __s = pcVar4;
        }
        local_58 = (double)CONCAT44(uVar21,uVar20);
        if (tempULL._7_1_ == 0) {
          cVar2 = (iVar16 == 0) + 'e';
          uVar13 = 0;
          do {
            local_40 = 0x2e25;
            if (uVar13 < 10) {
              cStack_3e = (char)uVar13 + '0';
              puVar6 = (undefined4 *)auStack_3c;
              cStack_3d = cVar2;
            }
            else {
              cStack_3e = '1';
              cStack_3d = (char)uVar13 + '&';
              auStack_3c[0] = cVar2;
              puVar6 = (undefined4 *)((long)auStack_3c + 1);
            }
            *(undefined1 *)puVar6 = 0;
            snprintf(__s,999,(char *)&local_40,local_68);
            __isoc99_sscanf(__s,"%lf",&local_80);
            pcVar18 = (char *)temp;
            pcVar4 = local_70;
          } while (((local_80 != (double)CONCAT44(uStack_64,local_68)) ||
                   (NAN(local_80) || NAN((double)CONCAT44(uStack_64,local_68)))) &&
                  (bVar19 = uVar13 < 0x12, uVar13 = uVar13 + 1, bVar19));
        }
        else {
          if ((double)CONCAT44(uStack_64,local_68) < 0.0) {
            __assert_fail("d >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                          ,0x3d2,"static char *cashew::JSPrinter::numToString(double, bool)");
          }
          cVar2 = ::wasm::isUInteger64((double)CONCAT44(uStack_64,local_68));
          if (cVar2 == '\0') {
            pcVar7 = "%.0f";
            if (iVar16 != 0) {
              pcVar7 = "%e";
            }
            snprintf(__s,999,pcVar7,local_68);
            __isoc99_sscanf(__s,"%lf",&local_80);
          }
          else {
            uVar5 = ::wasm::toUInteger64((double)CONCAT44(uStack_64,local_68));
            bVar17 = (byte)local_44;
            pcVar18 = "%llu";
            if ((iVar16 != 0 & bVar17) != 0) {
              pcVar18 = "0x%llx";
            }
            snprintf(__s,999,pcVar18,uVar5);
            if ((iVar16 != 0 & bVar17) == 0) {
              __isoc99_sscanf(__s,"%lf",&local_80);
              pcVar18 = (char *)temp;
              pcVar4 = local_70;
            }
            else {
              __isoc99_sscanf(__s,"%llx",&local_40);
              local_80 = ((double)CONCAT44(0x45300000,auStack_3c) - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,
                                           CONCAT13(cStack_3d,CONCAT12(cStack_3e,local_40))) -
                         4503599627370496.0);
              pcVar18 = (char *)temp;
              pcVar4 = local_70;
            }
          }
        }
        dVar22 = ABS(local_80 - (double)CONCAT44(uStack_64,local_68));
        if (iVar16 == 0) {
          local_58 = dVar22;
          dVar22 = local_50;
        }
        local_50 = dVar22;
        pcVar7 = strchr(__s,0x2e);
        uVar20 = SUB84(local_58,0);
        uVar21 = (undefined4)((ulong)local_58 >> 0x20);
        if (pcVar7 == (char *)0x0) {
          if ((tempULL._7_1_ & iVar16 != 0) == 0) {
            sVar10 = strlen(__s);
            uVar13 = 0xffffffff;
            uVar9 = 0;
            do {
              uVar1 = uVar9 - 1;
              uVar13 = uVar13 + 1;
              if ((long)(uVar9 + sVar10 + -1) < 0x19 && __s[(uVar9 - 1) + sVar10] != '0') break;
              lVar14 = uVar9 + sVar10;
              uVar9 = uVar1;
            } while (__s < __s + lVar14 + -1);
            uVar9 = ~uVar1;
            iVar3 = (int)uVar9;
            uVar20 = SUB84(local_58,0);
            uVar21 = (undefined4)((ulong)local_58 >> 0x20);
            if (2 < iVar3) {
              __s[uVar1 + sVar10 + 1] = 'e';
              cVar2 = (char)uVar1;
              if (iVar3 < 10) {
                cVar2 = '/' - cVar2;
                lVar14 = 3;
                lVar15 = 2;
              }
              else if (iVar3 < 100) {
                __s[uVar1 + sVar10 + 2] = (char)((uVar9 & 0xffffffff) / 10) + '0';
                cVar2 = ((char)(uVar13 / 10) * -10 + '/') - cVar2;
                lVar14 = 4;
                lVar15 = 3;
              }
              else {
                if (999 < iVar3) {
                  __assert_fail("num < 1000",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                                ,0x418,"static char *cashew::JSPrinter::numToString(double, bool)");
                }
                __s[uVar1 + sVar10 + 2] = (char)((uVar9 & 0xffffffff) / 100) + '0';
                __s[uVar1 + sVar10 + 3] = (byte)((~((uVar13 / 100) * 100) - (int)uVar1) / 10) | 0x30
                ;
                cVar2 = ((char)(uVar13 / 10) * -10 + '/') - cVar2;
                lVar14 = 5;
                lVar15 = 4;
              }
              __s[uVar1 + lVar15 + sVar10] = cVar2;
              __s[uVar1 + lVar14 + sVar10] = '\0';
            }
          }
        }
        else {
          pcVar12 = pcVar7 + -1;
          do {
            pcVar7 = pcVar7 + 1;
            pcVar8 = pcVar12 + 2;
            pcVar12 = pcVar12 + 1;
          } while ((byte)(*pcVar8 - 0x30U) < 10);
          cVar2 = *pcVar12;
          while (pcVar8 = pcVar7, cVar2 == '0') {
            do {
              cVar2 = *pcVar8;
              pcVar8[-1] = cVar2;
              pcVar8 = pcVar8 + 1;
            } while (cVar2 != '\0');
            pcVar7 = pcVar7 + -1;
            pcVar8 = pcVar12 + -1;
            pcVar12 = pcVar12 + -1;
            cVar2 = *pcVar8;
          }
          while (pcVar7 = __s, *__s == '0') {
            do {
              pcVar12 = pcVar7 + 1;
              *pcVar7 = *pcVar12;
              pcVar7 = pcVar7 + 1;
            } while (*pcVar12 != '\0');
          }
        }
        bVar19 = iVar16 != 0;
        iVar16 = iVar16 + 1;
        if (bVar19) {
          if ((local_50 != (double)CONCAT44(uVar21,uVar20)) ||
             (NAN(local_50) || NAN((double)CONCAT44(uVar21,uVar20)))) {
            bVar19 = local_50 <= (double)CONCAT44(uVar21,uVar20) &&
                     (double)CONCAT44(uVar21,uVar20) != local_50;
          }
          else {
            sVar10 = strlen(pcVar4);
            sVar11 = strlen(pcVar18);
            bVar19 = sVar10 < sVar11;
          }
          if (bVar19) {
            pcVar18 = pcVar4;
          }
          if (0.0 <= d) {
            return pcVar18;
          }
          pcVar18[-1] = '-';
          return pcVar18 + -1;
        }
      } while( true );
    }
    pcVar4 = "-Infinity";
    pcVar18 = "-Infinity";
  }
  pcVar18 = pcVar18 + 1;
  if ((long)d < 0) {
    pcVar18 = pcVar4;
  }
  return pcVar18;
}

Assistant:

static char* numToString(double d, bool finalize = true) {
    if (std::isnan(d)) {
      if (std::signbit(d)) {
        return (char*)"-NaN";
      } else {
        return (char*)"NaN";
      }
    } else if (!std::isfinite(d)) {
      if (std::signbit(d)) {
        return (char*)"-Infinity";
      } else {
        return (char*)"Infinity";
      }
    }
    bool neg = d < 0;
    if (neg) {
      d = -d;
    }
    // try to emit the fewest necessary characters
    bool integer = wasm::isInteger(d);
#define BUFFERSIZE 1000
    // f is normal, e is scientific for float, x for integer
    // These need to be thread-local because they are returned.
    thread_local char full_storage_f[BUFFERSIZE];
    thread_local char full_storage_e[BUFFERSIZE];
    // full has one more char, for a possible '-'
    char* storage_f = full_storage_f + 1;
    char* storage_e = full_storage_e + 1;
    auto err_f = std::numeric_limits<double>::quiet_NaN();
    auto err_e = std::numeric_limits<double>::quiet_NaN();
    for (int e = 0; e <= 1; e++) {
      char* buffer = e ? storage_e : storage_f;
      double temp;
      if (!integer) {
        char format[6];
        for (int i = 0; i <= 18; i++) {
          format[0] = '%';
          format[1] = '.';
          if (i < 10) {
            format[2] = '0' + i;
            format[3] = e ? 'e' : 'f';
            format[4] = 0;
          } else {
            format[2] = '1';
            format[3] = '0' + (i - 10);
            format[4] = e ? 'e' : 'f';
            format[5] = 0;
          }
          snprintf(buffer, BUFFERSIZE - 1, format, d);
          sscanf(buffer, "%lf", &temp);
          // errv("%.18f, %.18e   =>   %s   =>   %.18f, %.18e   (%d), ", d, d,
          // buffer, temp, temp, temp == d);
          if (temp == d) {
            break;
          }
        }
      } else {
        // integer
        assert(d >= 0);
        if (wasm::isUInteger64(d)) {
          unsigned long long uu = wasm::toUInteger64(d);
          bool asHex = e && !finalize;
          snprintf(buffer, BUFFERSIZE - 1, asHex ? "0x%llx" : "%llu", uu);
          if (asHex) {
            unsigned long long tempULL;
            sscanf(buffer, "%llx", &tempULL);
            temp = (double)tempULL;
          } else {
            sscanf(buffer, "%lf", &temp);
          }
        } else {
          // too large for a machine integer, just use floats
          // even on integers, e with a dot is useful, e.g. 1.2e+200
          snprintf(buffer, BUFFERSIZE - 1, e ? "%e" : "%.0f", d);
          sscanf(buffer, "%lf", &temp);
        }
        // errv("%.18f, %.18e   =>   %s   =>   %.18f, %.18e, %llu   (%d)\n", d,
        //      d, buffer, temp, temp, uu, temp == d);
      }
      (e ? err_e : err_f) = fabs(temp - d);
      // errv("current attempt: %.18f  =>  %s", d, buffer);
      // assert(temp == d);
      char* dot = strchr(buffer, '.');
      if (dot) {
        // remove trailing zeros
        char* end = dot + 1;
        while (*end >= '0' && *end <= '9') {
          end++;
        }
        end--;
        while (*end == '0') {
          char* copy = end;
          do {
            copy[0] = copy[1];
          } while (*copy++ != 0);
          end--;
        }
        // errv("%.18f  =>   %s", d, buffer);
        // remove preceding zeros
        while (*buffer == '0') {
          char* copy = buffer;
          do {
            copy[0] = copy[1];
          } while (*copy++ != 0);
        }
        // errv("%.18f ===>  %s", d, buffer);
      } else if (!integer || !e) {
        // no dot. try to change 12345000 => 12345e3
        char* end = strchr(buffer, 0);
        end--;
        char* test = end;
        // remove zeros, and also doubles can use at most 24 digits, we can
        // truncate any extras even if not zero
        while ((*test == '0' || test - buffer > 24) && test > buffer) {
          test--;
        }
        int num = end - test;
        if (num >= 3) {
          test++;
          test[0] = 'e';
          if (num < 10) {
            test[1] = '0' + num;
            test[2] = 0;
          } else if (num < 100) {
            test[1] = '0' + (num / 10);
            test[2] = '0' + (num % 10);
            test[3] = 0;
          } else {
            assert(num < 1000);
            test[1] = '0' + (num / 100);
            test[2] = '0' + (num % 100) / 10;
            test[3] = '0' + (num % 10);
            test[4] = 0;
          }
        }
      }
      // errv("..current attempt: %.18f  =>  %s", d, buffer);
    }
    // fprintf(stderr, "options:\n%s\n%s\n (first? %d)\n", storage_e, storage_f,
    //         strlen(storage_e) < strlen(storage_f));
    char* ret;
    if (err_e == err_f) {
      ret = strlen(storage_e) < strlen(storage_f) ? storage_e : storage_f;
    } else {
      ret = err_e < err_f ? storage_e : storage_f;
    }
    if (neg) {
      ret--; // safe to go back one, there is one more char in full_*
      *ret = '-';
    }
    return ret;
  }